

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  cmGeneratorTarget *this;
  _Alloc_hider __p;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar4;
  string *psVar5;
  ostream *poVar6;
  int iVar7;
  pointer ppcVar8;
  bool local_359;
  cmGeneratorTarget *tgt_local;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string reportEntry;
  string report;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  undefined8 local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  undefined8 local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  undefined8 local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  char *local_268;
  pointer local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  string local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  string interfaceProperty;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [22];
  string local_50 [32];
  
  local_268 = defaultValue;
  getTypedProperty<std::__cxx11::string>
            (__return_storage_ptr__,tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&headPropKeys,tgt);
  bVar1 = cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&headPropKeys,p);
  bVar2 = cm::
          contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&tgt->LinkImplicitNullProperties,p);
  if (bVar1 && bVar2) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x18d2,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  pvVar4 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar4->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar4->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    cmStrCat<char_const(&)[12],std::__cxx11::string_const&>
              (&report,(char (*) [12])" * Target \"",psVar5);
    if (bVar1) {
      std::__cxx11::string::append((char *)&report);
      std::__cxx11::string::string((string *)&local_288,(string *)__return_storage_ptr__);
      _e = (pointer)local_1b8;
      if (local_288 == &local_278) {
        local_1b8[0]._8_8_ = local_278._8_8_;
      }
      else {
        _e = (pointer)local_288;
      }
      local_1b8[0]._M_allocated_capacity._1_7_ = local_278._1_7_;
      local_1b8[0]._M_local_buf[0] = local_278._M_local_buf[0];
      local_280 = 0;
      local_278._M_local_buf[0] = '\0';
      local_288 = &local_278;
      std::__cxx11::string::append((string *)&report);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_288);
    }
    std::__cxx11::string::append((char *)&report);
    std::operator+(&interfaceProperty,"INTERFACE_",p);
    genexInterpreter._M_t.
    super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>,_true,_true>
          )(__uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
            )0x0;
    bVar3 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    if (bVar3) {
      consistent._0_8_ = tgt->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)&e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&consistent,
                 (cmGeneratorTarget **)config);
      __p._M_p = _e;
      _e = (pointer)0x0;
      std::
      __uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::reset((__uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
               *)&genexInterpreter,(pointer)__p._M_p);
      std::
      unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::~unique_ptr((unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                     *)&e);
    }
    local_260 = (pvVar4->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_359 = bVar1;
    for (ppcVar8 = (pvVar4->
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppcVar8 != local_260;
        ppcVar8 = ppcVar8 + 1) {
      this = *ppcVar8;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&propKeys,this);
      bVar3 = cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&propKeys,&interfaceProperty);
      getTypedProperty<std::__cxx11::string>
                (&ifacePropContent,this,&interfaceProperty,
                 (cmGeneratorExpressionInterpreter *)
                 genexInterpreter._M_t.
                 super___uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionInterpreter_*,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false>._M_head_impl);
      reportEntry._M_dataplus._M_p = (pointer)&reportEntry.field_2;
      reportEntry._M_string_length = 0;
      reportEntry.field_2._M_local_buf[0] = '\0';
      if (bVar3) {
        std::__cxx11::string::append((char *)&reportEntry);
        cmGeneratorTarget::GetName_abi_cxx11_(this);
        std::__cxx11::string::append((string *)&reportEntry);
        std::__cxx11::string::append((char *)&reportEntry);
        std::__cxx11::string::string((string *)&local_2c8,(string *)&ifacePropContent);
        _e = (pointer)local_1b8;
        if (local_2c8 == &local_2b8) {
          local_1b8[0]._8_8_ = local_2b8._8_8_;
        }
        else {
          _e = (pointer)local_2c8;
        }
        local_1b8[0]._M_allocated_capacity._1_7_ = local_2b8._M_allocated_capacity._1_7_;
        local_1b8[0]._M_local_buf[0] = local_2b8._M_local_buf[0];
        local_2c0 = 0;
        local_2b8._M_local_buf[0] = '\0';
        local_2c8 = &local_2b8;
        std::__cxx11::string::append((string *)&reportEntry);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::append((char *)&reportEntry);
        if (bVar1) {
          consistentProperty(&consistent,__return_storage_ptr__,&ifacePropContent,t);
          std::__cxx11::string::append((string *)&report);
          bVar3 = std::operator!=(__return_storage_ptr__,&consistent.second);
          compatibilityAgree_abi_cxx11_((string *)&e,t,bVar3);
          std::__cxx11::string::append((string *)&report);
          std::__cxx11::string::~string((string *)&e);
          if (consistent.first == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar6 = std::operator<<((ostream *)&e,"Property ");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," on target \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar6 = std::operator<<(poVar6,(string *)psVar5);
            poVar6 = std::operator<<(poVar6,"\" does\nnot match the INTERFACE_");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," property requirement\nof dependency \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this);
            poVar6 = std::operator<<(poVar6,(string *)psVar5);
            std::operator<<(poVar6,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_238);
LAB_0038c86b:
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            iVar7 = 2;
          }
          else {
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            iVar7 = 3;
          }
LAB_0038c883:
          std::__cxx11::string::~string((string *)&consistent.second);
        }
        else {
          if (bVar2) goto LAB_0038c542;
          if (local_359 == false) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                           &reportEntry,"(Interface set)\n");
            std::__cxx11::string::append((string *)&report);
            std::__cxx11::string::~string((string *)&e);
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            local_359 = true;
            iVar7 = 0;
          }
          else {
            consistentProperty(&consistent,__return_storage_ptr__,&ifacePropContent,t);
            std::__cxx11::string::append((string *)&report);
            bVar3 = std::operator!=(__return_storage_ptr__,&consistent.second);
            compatibilityAgree_abi_cxx11_((string *)&e,t,bVar3);
            std::__cxx11::string::append((string *)&report);
            std::__cxx11::string::~string((string *)&e);
            if (consistent.first == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar6 = std::operator<<((ostream *)&e,"The INTERFACE_");
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," property of \"");
              psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this);
              poVar6 = std::operator<<(poVar6,(string *)psVar5);
              poVar6 = std::operator<<(poVar6,"\" does\nnot agree with the value of ");
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," already determined\nfor \"");
              psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar6 = std::operator<<(poVar6,(string *)psVar5);
              std::operator<<(poVar6,"\".\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_238);
              std::__cxx11::string::~string((string *)&local_238);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              iVar7 = 2;
            }
            else {
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              iVar7 = 3;
            }
            std::__cxx11::string::~string((string *)&consistent.second);
            local_359 = true;
          }
        }
      }
      else {
        if (bVar2 && !bVar1) {
LAB_0038c542:
          std::__cxx11::string::string(local_50,(string *)__return_storage_ptr__);
          _e = (pointer)local_1b8;
          local_1b8[0]._M_allocated_capacity =
               local_1b8[0]._M_allocated_capacity & 0xffffffffffffff00;
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::~string(local_50);
          if (bVar3) {
            consistentProperty(&consistent,__return_storage_ptr__,&ifacePropContent,t);
            std::__cxx11::string::append((string *)&report);
            bVar3 = std::operator!=(__return_storage_ptr__,&consistent.second);
            compatibilityAgree_abi_cxx11_((string *)&e,t,bVar3);
            std::__cxx11::string::append((string *)&report);
            std::__cxx11::string::~string((string *)&e);
            if (consistent.first == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar6 = std::operator<<((ostream *)&e,"Property ");
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," on target \"");
              psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar6 = std::operator<<(poVar6,(string *)psVar5);
              poVar6 = std::operator<<(poVar6,"\" is\nimplied to be ");
              poVar6 = std::operator<<(poVar6,local_268);
              poVar6 = std::operator<<(poVar6,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," property on\ndependency \"");
              psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this);
              poVar6 = std::operator<<(poVar6,(string *)psVar5);
              std::operator<<(poVar6,"\" is in conflict.\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_238);
              goto LAB_0038c86b;
            }
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            iVar7 = 3;
            goto LAB_0038c883;
          }
        }
        iVar7 = 3;
      }
      std::__cxx11::string::~string((string *)&reportEntry);
      std::__cxx11::string::~string((string *)&ifacePropContent);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&propKeys);
      if ((iVar7 != 3) && (iVar7 != 0)) break;
    }
    std::__cxx11::string::string((string *)&local_2a8,(string *)__return_storage_ptr__);
    _e = (pointer)local_1b8;
    if (local_2a8 == &local_298) {
      local_1b8[0]._8_8_ = local_298._8_8_;
    }
    else {
      _e = (pointer)local_2a8;
    }
    local_2a0 = 0;
    local_298._M_local_buf[0] = '\0';
    local_2a8 = &local_298;
    compatibilityType_abi_cxx11_((string *)&consistent,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,(string *)&e,&report,(string *)&consistent);
    std::__cxx11::string::~string((string *)&consistent);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr(&genexInterpreter);
    std::__cxx11::string::~string((string *)&interfaceProperty);
    std::__cxx11::string::~string((string *)&report);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&headPropKeys);
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}